

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockVector::AddDetailedStatistics(VmaBlockVector *this,VmaDetailedStatistics *inoutStats)

{
  VmaBlockMetadata *pVVar1;
  size_t sVar2;
  undefined8 in_RSI;
  VmaRWMutex *in_RDI;
  VmaDeviceMemoryBlock *pBlock;
  uint32_t blockIndex;
  size_t blockCount;
  VmaMutexLockRead lock;
  VmaMutexLockRead *in_stack_ffffffffffffffb0;
  VmaMutexLockRead *in_stack_ffffffffffffffc0;
  uint local_30;
  
  VmaMutexLockRead::VmaMutexLockRead
            (in_stack_ffffffffffffffc0,in_RDI,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
  sVar2 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::size
                    ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_> *)
                     ((long)&in_RDI[2].m_Mutex._M_impl._M_rwlock + 0x20));
  for (local_30 = 0; local_30 < sVar2; local_30 = local_30 + 1) {
    in_stack_ffffffffffffffb0 =
         (VmaMutexLockRead *)
         VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::operator[]
                   ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_> *)
                    ((long)&in_RDI[2].m_Mutex._M_impl._M_rwlock + 0x20),(ulong)local_30);
    pVVar1 = ((VmaDeviceMemoryBlock *)in_stack_ffffffffffffffb0->m_pMutex)->m_pMetadata;
    (*pVVar1->_vptr_VmaBlockMetadata[0xe])(pVVar1,in_RSI);
  }
  VmaMutexLockRead::~VmaMutexLockRead(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void VmaBlockVector::AddDetailedStatistics(VmaDetailedStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);

    const size_t blockCount = m_Blocks.size();
    for (uint32_t blockIndex = 0; blockIndex < blockCount; ++blockIndex)
    {
        const VmaDeviceMemoryBlock* const pBlock = m_Blocks[blockIndex];
        VMA_ASSERT(pBlock);
        VMA_HEAVY_ASSERT(pBlock->Validate());
        pBlock->m_pMetadata->AddDetailedStatistics(inoutStats);
    }
}